

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::NamedValueExpression::evalImpl(NamedValueExpression *this,EvalContext *context)

{
  int iVar1;
  string_view arg;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange referencingRange;
  bool bVar2;
  ConstantValue *pCVar3;
  SVQueue *this_00;
  FormalArgumentSymbol *pFVar4;
  VariableSymbol *pVVar5;
  EvalContext *in_RDX;
  EvalContext *in_RSI;
  Diagnostic *in_RDI;
  ParameterSymbol *in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  SpecparamSymbol *in_stack_00000068;
  SourceRange in_stack_00000070;
  Diagnostic *diag;
  ConstantValue *v;
  int32_t size;
  ConstantValue *target;
  ConstantValue v_1;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  Diagnostic *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  bitwidth_t bits;
  SourceLocation noteLocation;
  ValueSymbol *in_stack_fffffffffffffe80;
  DiagCode noteCode;
  EvalContext *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  DiagCode code;
  bitmask<slang::ast::VariableFlags> local_d2;
  TempVarSymbol *local_d0;
  RandomizeDetails *local_c8;
  undefined4 local_be;
  bitmask<slang::ast::EvalFlags> local_b9;
  ConstantValue *local_b8;
  TempVarSymbol *local_b0;
  RandomizeDetails *local_a8;
  TempVarSymbol *local_a0;
  RandomizeDetails *local_98;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  NamedValueExpression *in_stack_ffffffffffffff78;
  EnumValueSymbol *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  SourceLocation in_stack_ffffffffffffffa8;
  
  bits = (bitwidth_t)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  code = SUB84((ulong)in_stack_fffffffffffffed0 >> 0x20,0);
  bVar2 = checkConstant(in_stack_ffffffffffffff78,
                        (EvalContext *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                       );
  if (bVar2) {
    iVar1 = *(int *)&((in_RSI->astCtx).assertionInstance)->symbol;
    if (iVar1 == 0xb) {
      Symbol::as<slang::ast::EnumValueSymbol>((Symbol *)0xa00820);
      local_a0 = (in_RSI->astCtx).firstTempVar;
      local_98 = (in_RSI->astCtx).randomizeDetails;
      referencingRange.endLoc = in_stack_ffffffffffffffa8;
      referencingRange.startLoc = in_stack_ffffffffffffffa0;
      EnumValueSymbol::getValue(in_stack_ffffffffffffff98,referencingRange);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffe70,
                 (ConstantValue *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    }
    else if (iVar1 == 0x27) {
      Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0xa00682);
      ParameterSymbol::getValue(in_stack_00000018,(SourceRange)in_stack_00000020);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffe70,
                 (ConstantValue *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      bVar2 = slang::ConstantValue::isUnbounded((ConstantValue *)0xa006ca);
      if ((bVar2) && (pCVar3 = EvalContext::getQueueTarget(in_RDX), pCVar3 != (ConstantValue *)0x0))
      {
        slang::ConstantValue::queue((ConstantValue *)0xa0071a);
        this_00 = CopyPtr<slang::SVQueue>::operator->((CopyPtr<slang::SVQueue> *)0xa0072b);
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                  ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0xa0073c);
        SVInt::SVInt((SVInt *)this_00,bits,(uint64_t)in_stack_fffffffffffffe70,
                     (bool)in_stack_fffffffffffffe6f);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffe70,
                   (SVInt *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
        SVInt::~SVInt((SVInt *)this_00);
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffe70,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa007fb);
    }
    else if (iVar1 == 0x4a) {
      Symbol::as<slang::ast::SpecparamSymbol>((Symbol *)0xa00875);
      local_b0 = (in_RSI->astCtx).firstTempVar;
      local_a8 = (in_RSI->astCtx).randomizeDetails;
      SpecparamSymbol::getValue(in_stack_00000068,in_stack_00000070);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffe70,
                 (ConstantValue *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    }
    else {
      local_b8 = EvalContext::findLocal(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      noteCode = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
      if (local_b8 == (ConstantValue *)0x0) {
        noteLocation = (SourceLocation)&in_RDX->flags;
        bitmask<slang::ast::EvalFlags>::bitmask(&local_b9,CovergroupExpr);
        bVar2 = bitmask<slang::ast::EvalFlags>::has
                          ((bitmask<slang::ast::EvalFlags> *)in_stack_fffffffffffffe70,
                           (bitmask<slang::ast::EvalFlags> *)
                           CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
        if (bVar2) {
          if (*(int *)&((in_RSI->astCtx).assertionInstance)->symbol == 0x3d) {
            pFVar4 = Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0xa00958);
            if (pFVar4->direction == Ref) {
              local_be = 0x460007;
              local_d0 = (in_RSI->astCtx).firstTempVar;
              local_c8 = (in_RSI->astCtx).randomizeDetails;
              range.endLoc._0_4_ = in_stack_fffffffffffffec8;
              range.startLoc = (SourceLocation)in_stack_fffffffffffffec0;
              range.endLoc._4_4_ = in_stack_fffffffffffffecc;
              EvalContext::addDiag(in_RSI,code,range);
            }
          }
          else {
            bVar2 = VariableSymbol::isKind
                              (*(SymbolKind *)&((in_RSI->astCtx).assertionInstance)->symbol);
            if (bVar2) {
              pVVar5 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xa009db);
              in_stack_fffffffffffffe70 = (Diagnostic *)&pVVar5->flags;
              bitmask<slang::ast::VariableFlags>::bitmask(&local_d2,Const);
              bVar2 = bitmask<slang::ast::VariableFlags>::has
                                ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffe70,
                                 (bitmask<slang::ast::VariableFlags> *)
                                 CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                range_00.endLoc._0_4_ = in_stack_fffffffffffffec8;
                range_00.startLoc = (SourceLocation)in_stack_fffffffffffffec0;
                range_00.endLoc._4_4_ = in_stack_fffffffffffffecc;
                EvalContext::addDiag(in_RSI,code,range_00);
              }
            }
            else if ((*(int *)&((in_RSI->astCtx).assertionInstance)->symbol != 0x27) &&
                    (*(int *)&((in_RSI->astCtx).assertionInstance)->symbol != 0xb)) {
              range_01.endLoc._0_4_ = in_stack_fffffffffffffec8;
              range_01.startLoc = (SourceLocation)in_stack_fffffffffffffec0;
              range_01.endLoc._4_4_ = in_stack_fffffffffffffecc;
              EvalContext::addDiag(in_RSI,code,range_01);
            }
          }
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffe70,
                     (nullptr_t)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
        }
        else {
          range_02.endLoc._0_4_ = in_stack_fffffffffffffec8;
          range_02.startLoc = (SourceLocation)in_stack_fffffffffffffec0;
          range_02.endLoc._4_4_ = in_stack_fffffffffffffecc;
          EvalContext::addDiag(in_RSI,code,range_02);
          arg._M_str = in_stack_fffffffffffffec0;
          arg._M_len = (size_t)in_RSI;
          Diagnostic::operator<<(in_RDI,arg);
          Diagnostic::addNote(in_stack_fffffffffffffe70,noteCode,noteLocation);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffe70,
                     (nullptr_t)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
        }
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffe70,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe70,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  }
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue NamedValueExpression::evalImpl(EvalContext& context) const {
    if (!checkConstant(context))
        return nullptr;

    switch (symbol.kind) {
        case SymbolKind::Parameter: {
            auto v = symbol.as<ParameterSymbol>().getValue(sourceRange);
            if (v.isUnbounded()) {
                if (auto target = context.getQueueTarget()) {
                    int32_t size = (int32_t)target->queue()->size();
                    return SVInt(32, uint64_t(size - 1), true);
                }
            }
            return v;
        }
        case SymbolKind::EnumValue:
            return symbol.as<EnumValueSymbol>().getValue(sourceRange);
        case SymbolKind::Specparam:
            return symbol.as<SpecparamSymbol>().getValue(sourceRange);
        default:
            ConstantValue* v = context.findLocal(&symbol);
            if (v)
                return *v;
            break;
    }

    // Special casing for covergroup expressions: they are required to be
    // constant, except they can also reference local non-elaboration constants
    // and non-ref formal args.
    if (context.flags.has(EvalFlags::CovergroupExpr)) {
        if (symbol.kind == SymbolKind::FormalArgument) {
            if (symbol.as<FormalArgumentSymbol>().direction == ArgumentDirection::Ref)
                context.addDiag(diag::CoverageExprVar, sourceRange);
        }
        else if (VariableSymbol::isKind(symbol.kind)) {
            if (!symbol.as<VariableSymbol>().flags.has(VariableFlags::Const))
                context.addDiag(diag::CoverageExprVar, sourceRange);
        }
        else if (symbol.kind != SymbolKind::Parameter && symbol.kind != SymbolKind::EnumValue) {
            context.addDiag(diag::CoverageExprVar, sourceRange);
        }
        return nullptr;
    }

    // If we reach this point, the variable was not found, which should mean that
    // it's not actually constant.
    auto& diag = context.addDiag(diag::ConstEvalNonConstVariable, sourceRange) << symbol.name;
    diag.addNote(diag::NoteDeclarationHere, symbol.location);
    return nullptr;
}